

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O3

void bufchain_add(bufchain *ch,void *data,size_t len)

{
  char **ppcVar1;
  char *__dest;
  bufchain_granule *pbVar2;
  bufchain *pbVar3;
  ulong uVar4;
  
  if (len == 0) {
    return;
  }
  ch->buffersize = ch->buffersize + len;
  pbVar2 = ch->tail;
  do {
    if (pbVar2 != (bufchain_granule *)0x0) {
      __dest = pbVar2->bufend;
      if (__dest < pbVar2->bufmax) {
        uVar4 = (long)pbVar2->bufmax - (long)__dest;
        if (len < uVar4) {
          uVar4 = len;
        }
        memcpy(__dest,data,uVar4);
        ppcVar1 = &ch->tail->bufend;
        *ppcVar1 = *ppcVar1 + uVar4;
        len = len - uVar4;
        if (len == 0) {
          if (ch->ic == (IdempotentCallback *)0x0) {
            return;
          }
          (*ch->queue_idempotent_callback)(ch->ic);
          return;
        }
        data = (void *)((long)data + uVar4);
      }
    }
    uVar4 = len + 0x20;
    if (uVar4 < 0x201) {
      uVar4 = 0x200;
    }
    pbVar2 = (bufchain_granule *)safemalloc(uVar4,1,0);
    pbVar2->bufend = (char *)(pbVar2 + 1);
    pbVar2->bufpos = (char *)(pbVar2 + 1);
    pbVar2->bufmax = (char *)((long)&pbVar2->next + uVar4);
    pbVar2->next = (bufchain_granule *)0x0;
    pbVar3 = (bufchain *)ch->tail;
    if ((bufchain *)ch->tail == (bufchain *)0x0) {
      pbVar3 = ch;
    }
    pbVar3->head = pbVar2;
    ch->tail = pbVar2;
  } while( true );
}

Assistant:

void bufchain_add(bufchain *ch, const void *data, size_t len)
{
    const char *buf = (const char *)data;

    if (len == 0) return;

    ch->buffersize += len;

    while (len > 0) {
        if (ch->tail && ch->tail->bufend < ch->tail->bufmax) {
            size_t copylen = min(len, ch->tail->bufmax - ch->tail->bufend);
            memcpy(ch->tail->bufend, buf, copylen);
            buf += copylen;
            len -= copylen;
            ch->tail->bufend += copylen;
        }
        if (len > 0) {
            size_t grainlen =
                max(sizeof(struct bufchain_granule) + len, BUFFER_MIN_GRANULE);
            struct bufchain_granule *newbuf;
            newbuf = smalloc(grainlen);
            newbuf->bufpos = newbuf->bufend =
                (char *)newbuf + sizeof(struct bufchain_granule);
            newbuf->bufmax = (char *)newbuf + grainlen;
            newbuf->next = NULL;
            if (ch->tail)
                ch->tail->next = newbuf;
            else
                ch->head = newbuf;
            ch->tail = newbuf;
        }
    }

    if (ch->ic)
        ch->queue_idempotent_callback(ch->ic);
}